

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeViewPrivate::collapse(QTreeViewPrivate *this,int item,bool emitSignal)

{
  QList<QTreeViewItem> *this_00;
  QTreeViewItem *pQVar1;
  State SVar2;
  Data *pDVar3;
  QAbstractItemView *this_01;
  QTreeViewItem *pQVar4;
  ulong uVar5;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_02;
  uint uVar6;
  pointer pQVar7;
  long in_FS_OFFSET;
  Bucket BVar8;
  iterator it;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((item != -1) && (pDVar3 = (this->expandedIndexes).q_hash.d, pDVar3 != (Data *)0x0)) &&
     (pDVar3->size != 0)) {
    this_01 = *(QAbstractItemView **)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    QBasicTimer::stop();
    pQVar4 = (this->viewItems).d.ptr;
    uVar5 = *(ulong *)&pQVar4[item].field_0x1c;
    local_58.m.ptr = pQVar4[item].index.m.ptr;
    pQVar1 = pQVar4 + item;
    local_58.r = (pQVar1->index).r;
    local_58.c = (pQVar1->index).c;
    local_58.i = (pQVar1->index).i;
    this_02 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90);
    if (this_02 !=
        (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
         *)0x0) {
      BVar8 = QHashPrivate::
              Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
              ::findBucket<QtPrivate::QModelIndexWrapper>(this_02,(QModelIndexWrapper *)&local_58);
      if ((BVar8.span[BVar8.index] != (Span)0xff) && (*(long *)(BVar8.span + 0x80) != 0)) {
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_58,&pQVar4[item].index);
        it = QHash<QPersistentModelIndex,_QHashDummyValue>::findImpl<QPersistentModelIndex>
                       (&(this->expandedIndexes).q_hash,(QPersistentModelIndex *)&local_58);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
        if ((it.i.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0 ||
             it.i.bucket != 0) && (((this->viewItems).d.ptr[item].field_0x1c & 1) != 0)) {
          if ((emitSignal) && (this->animationsEnabled == true)) {
            prepareAnimatedOperation(this,item,Backward);
          }
          this_00 = &this->viewItems;
          SVar2 = (this->super_QAbstractItemViewPrivate).state;
          if (SVar2 != AnimatingState) {
            (this->super_QAbstractItemViewPrivate).stateBeforeAnimation = SVar2;
          }
          QAbstractItemView::setState(this_01,CollapsingState);
          QHash<QPersistentModelIndex,_QHashDummyValue>::erase
                    (&(this->expandedIndexes).q_hash,(const_iterator)it.i);
          pQVar7 = QList<QTreeViewItem>::data(this_00);
          pQVar7[item].field_0x1c = pQVar7[item].field_0x1c & 0xfe;
          if (-1 < item) {
            uVar6 = item;
            do {
              pQVar7 = QList<QTreeViewItem>::data(this_00);
              *(ulong *)&pQVar7[uVar6].field_0x1c =
                   *(ulong *)&pQVar7[uVar6].field_0x1c & 0xffffffff0000000f |
                   (ulong)((int)*(ulong *)&pQVar7[uVar6].field_0x1c - ((uint)uVar5 & 0xfffffff0) &
                          0xfffffff0);
              pQVar7 = QList<QTreeViewItem>::data(this_00);
              uVar6 = pQVar7[uVar6].parentItem;
            } while (-1 < (int)uVar6);
          }
          removeViewItems(this,item + 1,(uint)(uVar5 >> 4) & 0xfffffff);
          QAbstractItemView::setState
                    (this_01,(this->super_QAbstractItemViewPrivate).stateBeforeAnimation);
          if (emitSignal) {
            local_58.r = 0;
            local_58.c = 0;
            local_58.i = (quintptr)(pQVar4 + item);
            QMetaObject::activate
                      ((QObject *)this_01,&QTreeView::staticMetaObject,1,(void **)&local_58);
            if (this->animationsEnabled == true) {
              beginAnimatedOperation(this);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::collapse(int item, bool emitSignal)
{
    Q_Q(QTreeView);

    if (item == -1 || expandedIndexes.isEmpty())
        return;

    //if the current item is now invisible, the autoscroll will expand the tree to see it, so disable the autoscroll
    delayedAutoScroll.stop();

    int total = viewItems.at(item).total;
    const QModelIndex &modelIndex = viewItems.at(item).index;
    if (!isPersistent(modelIndex))
        return; // if the index is not persistent, no chances it is expanded
    QSet<QPersistentModelIndex>::iterator it = expandedIndexes.find(modelIndex);
    if (it == expandedIndexes.end() || viewItems.at(item).expanded == false)
        return; // nothing to do

#if QT_CONFIG(animation)
    if (emitSignal && animationsEnabled)
        prepareAnimatedOperation(item, QVariantAnimation::Backward);
#endif // animation

    //if already animating, stateBeforeAnimation is set to the correct value
    if (state != QAbstractItemView::AnimatingState)
        stateBeforeAnimation = state;
    q->setState(QAbstractItemView::CollapsingState);
    expandedIndexes.erase(it);
    viewItems[item].expanded = false;
    int index = item;
    while (index > -1) {
        viewItems[index].total -= total;
        index = viewItems[index].parentItem;
    }
    removeViewItems(item + 1, total); // collapse
    q->setState(stateBeforeAnimation);

    if (emitSignal) {
        emit q->collapsed(modelIndex);
#if QT_CONFIG(animation)
        if (animationsEnabled)
            beginAnimatedOperation();
#endif // animation
    }
}